

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::DOMRangeImpl::indexOf(DOMRangeImpl *this,DOMNode *child,DOMNode *parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t XVar2;
  
  iVar1 = (*child->_vptr_DOMNode[5])(child);
  if ((DOMNode *)CONCAT44(extraout_var,iVar1) == parent) {
    XVar2 = 0xffffffffffffffff;
    do {
      iVar1 = (*child->_vptr_DOMNode[9])(child);
      child = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      XVar2 = XVar2 + 1;
    } while (child != (DOMNode *)0x0);
  }
  else {
    XVar2 = 0xffffffffffffffff;
  }
  return XVar2;
}

Assistant:

XMLSize_t DOMRangeImpl::indexOf(const DOMNode* child, const DOMNode* parent) const
{
    XMLSize_t i = 0;
    if (child->getParentNode() != parent) return (XMLSize_t)-1;
    for(DOMNode* node = child->getPreviousSibling(); node!= 0; node=node->getPreviousSibling()) {
        i++;
    }
    return i;
}